

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

int __thiscall
vkt::sr::anon_unknown_0::ShaderMatrixTests::init(ShaderMatrixTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  MatrixOp MVar2;
  InputType IVar3;
  DataType dataType;
  TestContext *pTVar4;
  int vecSize;
  int vecSize_00;
  DataType DVar5;
  TestNode *node;
  TestNode *node_00;
  char *pcVar6;
  ShaderMatrixCase *pSVar7;
  char *pcVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  InputType IVar13;
  InputTypeSpec *pIVar14;
  int numCols;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  bool bVar15;
  allocator<char> local_19d;
  Precision local_19c;
  TestNode *local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  ulong local_170;
  char local_162;
  char local_161;
  string vecMatName;
  ShaderInput colVecIn;
  ShaderInput matIn;
  ShaderInput scalarIn;
  ShaderInput rowVecIn;
  ShaderInput otherMatIn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  char *local_a0;
  string baseName;
  
  lVar9 = 0;
  do {
    if (lVar9 == 0x13) {
      return 0x13;
    }
    bVar1 = init::ops[lVar9].extendedInputTypeCases;
    pIVar14 = init::reducedInputTypes;
    if (bVar1 != false) {
      pIVar14 = init::extendedInputTypes;
    }
    MVar2 = init::ops[lVar9].op;
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
               init::ops[lVar9].name,init::ops[lVar9].desc);
    tcu::TestNode::addChild((TestNode *)this,node);
    local_162 = init::ops[lVar9].createInputTypeGroup;
    local_170 = (ulong)MVar2;
    for (lVar12 = 0; lVar12 != (ulong)bVar1 * 2 + 1; lVar12 = lVar12 + 1) {
      IVar3 = pIVar14[lVar12].type;
      node_00 = node;
      if (local_162 != '\0') {
        node_00 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)node_00,(this->super_TestCaseGroup).super_TestNode.m_testCtx,
                   pIVar14[lVar12].name,pIVar14[lVar12].desc);
        tcu::TestNode::addChild(node,node_00);
      }
      IVar13 = IVar3;
      if (IVar3 == INPUTTYPE_DYNAMIC) {
        IVar13 = INPUTTYPE_UNIFORM;
      }
      local_198 = node_00;
      for (lVar11 = 0; lVar11 != 9; lVar11 = lVar11 + 1) {
        bVar15 = (uint)local_170 == 0x11;
        dataType = init::matrixTypes[lVar11];
        vecSize = glu::getDataTypeMatrixNumColumns(dataType);
        vecSize_00 = glu::getDataTypeMatrixNumRows(dataType);
        local_a0 = glu::getDataTypeName(dataType);
        local_161 = MVar2 - OP_INVERSE < 2 && vecSize == vecSize_00;
        lVar10 = 0;
        while( true ) {
          __lhs = &local_c0;
          if (lVar10 == 2) break;
          local_19c = init::precisions[lVar10];
          pcVar6 = glu::getPrecisionName(local_19c);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__lhs,pcVar6,(allocator<char> *)&scalarIn);
          std::operator+(&local_190,__lhs,"_");
          std::operator+(&vecMatName,&local_190,local_a0);
          std::operator+(&baseName,&vecMatName,"_");
          std::__cxx11::string::~string((string *)&vecMatName);
          std::__cxx11::string::~string((string *)&local_190);
          std::__cxx11::string::~string((string *)__lhs);
          matIn.precision = local_19c;
          matIn.inputType = IVar3;
          matIn.dataType = dataType;
          if (3 < (uint)local_170) {
            switch((uint)local_170) {
            case 4:
              goto switchD_0058858e_caseD_4;
            case 5:
              scalarIn.dataType = glu::getDataTypeFloatVec(vecSize_00);
              scalarIn.inputType = IVar3;
              scalarIn.precision = local_19c;
              otherMatIn.dataType = glu::getDataTypeFloatVec(vecSize);
              otherMatIn.precision = local_19c;
              otherMatIn.inputType = IVar13;
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              std::operator+(&local_190,&baseName,"float_vertex");
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_190._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__lhs,"Vector-vector case",(allocator<char> *)&rowVecIn);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar4,&vecMatName,__lhs,&scalarIn,&otherMatIn,(MatrixOp)local_170,
                         true);
              tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
              std::__cxx11::string::~string((string *)__lhs);
              std::__cxx11::string::~string((string *)&vecMatName);
              std::__cxx11::string::~string((string *)&local_190);
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              std::operator+(&local_190,&baseName,"float_fragment");
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_190._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)__lhs,"Vector-vector case",(allocator<char> *)&rowVecIn);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar4,&vecMatName,__lhs,&scalarIn,&otherMatIn,(MatrixOp)local_170,
                         false);
              tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
              std::__cxx11::string::~string((string *)__lhs);
              std::__cxx11::string::~string((string *)&vecMatName);
              __lhs = &local_190;
              goto LAB_00588752;
            case 6:
            case 9:
            case 10:
            case 0xb:
            case 0xc:
            case 0xd:
            case 0xe:
              goto switchD_0058858e_caseD_6;
            default:
              goto switchD_0058858e_caseD_7;
            }
          }
          scalarIn.dataType = TYPE_FLOAT;
          scalarIn.inputType = (MVar2 != OP_DIV) + INPUTTYPE_UNIFORM;
          scalarIn.precision = local_19c;
          pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
          pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
          std::operator+(&local_190,&baseName,"float_vertex");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vecMatName,local_190._M_dataplus._M_p,(allocator<char> *)&otherMatIn
                    );
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__lhs,"Matrix-scalar case",(allocator<char> *)&colVecIn);
          ShaderMatrixCase::ShaderMatrixCase
                    (pSVar7,pTVar4,&vecMatName,__lhs,&matIn,&scalarIn,(MatrixOp)local_170,true);
          tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
          std::__cxx11::string::~string((string *)__lhs);
          std::__cxx11::string::~string((string *)&vecMatName);
          std::__cxx11::string::~string((string *)&local_190);
          pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
          pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
          std::operator+(&local_190,&baseName,"float_fragment");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vecMatName,local_190._M_dataplus._M_p,(allocator<char> *)&otherMatIn
                    );
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)__lhs,"Matrix-scalar case",(allocator<char> *)&colVecIn);
          ShaderMatrixCase::ShaderMatrixCase
                    (pSVar7,pTVar4,&vecMatName,__lhs,&matIn,&scalarIn,(MatrixOp)local_170,false);
          tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
          std::__cxx11::string::~string((string *)__lhs);
          std::__cxx11::string::~string((string *)&vecMatName);
          std::__cxx11::string::~string((string *)&local_190);
          if ((uint)local_170 == 2) {
            DVar5 = glu::getDataTypeFloatVec(vecSize);
            colVecIn.inputType = INPUTTYPE_DYNAMIC;
            colVecIn.precision = local_19c;
            colVecIn.dataType = DVar5;
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            pcVar8 = glu::getDataTypeName(DVar5);
            std::operator+(__lhs,&baseName,pcVar8);
            std::operator+(&local_190,__lhs,"_vertex");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_190._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&scalarIn,"Matrix-vector case",(allocator<char> *)&rowVecIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar4,&vecMatName,(string *)&scalarIn,&matIn,&colVecIn,OP_MUL,true);
            tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&scalarIn);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)__lhs);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            pcVar8 = glu::getDataTypeName(DVar5);
            std::operator+(__lhs,&baseName,pcVar8);
            std::operator+(&local_190,__lhs,"_fragment");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_190._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&scalarIn,"Matrix-vector case",(allocator<char> *)&rowVecIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar4,&vecMatName,(string *)&scalarIn,&matIn,&colVecIn,OP_MUL,false);
            tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&scalarIn);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)__lhs);
            DVar5 = glu::getDataTypeFloatVec(vecSize_00);
            rowVecIn.inputType = INPUTTYPE_DYNAMIC;
            rowVecIn.precision = local_19c;
            rowVecIn.dataType = DVar5;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&otherMatIn,pcVar6,&local_19d);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &scalarIn,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &otherMatIn,"_");
            pcVar6 = glu::getDataTypeName(DVar5);
            std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&scalarIn,pcVar6);
            std::operator+(&local_190,__lhs,"_");
            std::operator+(&vecMatName,&local_190,local_a0);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)__lhs);
            std::__cxx11::string::~string((string *)&scalarIn);
            std::__cxx11::string::~string((string *)&otherMatIn);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(__lhs,&vecMatName,"_vertex");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_190,local_c0._M_dataplus._M_p,(allocator<char> *)&otherMatIn
                      );
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&scalarIn,"Vector-matrix case",&local_19d);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar4,&local_190,(string *)&scalarIn,&rowVecIn,&matIn,OP_MUL,true);
            tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&scalarIn);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)__lhs);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(__lhs,&vecMatName,"_fragment");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_190,local_c0._M_dataplus._M_p,(allocator<char> *)&otherMatIn
                      );
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&scalarIn,"Vector-matrix case",&local_19d);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar4,&local_190,(string *)&scalarIn,&rowVecIn,&matIn,OP_MUL,false);
            tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&scalarIn);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)__lhs);
            std::__cxx11::string::~string((string *)&vecMatName);
            for (numCols = 2; numCols != 5; numCols = numCols + 1) {
              DVar5 = glu::getDataTypeMatrix(numCols,vecSize);
              otherMatIn.precision = local_19c;
              otherMatIn.inputType = IVar13;
              otherMatIn.dataType = DVar5;
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              pcVar6 = glu::getDataTypeName(DVar5);
              std::operator+(&local_c0,&baseName,pcVar6);
              std::operator+(&local_190,&local_c0,"_vertex");
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_190._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&scalarIn,"Matrix-matrix case",(allocator<char> *)&rowVecIn);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar4,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,OP_MUL,
                         true);
              tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
              std::__cxx11::string::~string((string *)&scalarIn);
              std::__cxx11::string::~string((string *)&vecMatName);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)&local_c0);
              pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
              pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
              pcVar6 = glu::getDataTypeName(DVar5);
              std::operator+(&local_c0,&baseName,pcVar6);
              std::operator+(&local_190,&local_c0,"_fragment");
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&vecMatName,local_190._M_dataplus._M_p,
                         (allocator<char> *)&colVecIn);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&scalarIn,"Matrix-matrix case",(allocator<char> *)&rowVecIn);
              ShaderMatrixCase::ShaderMatrixCase
                        (pSVar7,pTVar4,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,OP_MUL,
                         false);
              tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
              std::__cxx11::string::~string((string *)&scalarIn);
              std::__cxx11::string::~string((string *)&vecMatName);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)&local_c0);
            }
          }
          else {
switchD_0058858e_caseD_4:
            otherMatIn.precision = local_19c;
            otherMatIn.inputType = IVar13;
            otherMatIn.dataType = dataType;
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(__lhs,&baseName,local_a0);
            std::operator+(&local_190,__lhs,"_vertex");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_190._M_dataplus._M_p,(allocator<char> *)&colVecIn
                      );
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&scalarIn,"Matrix-matrix case",(allocator<char> *)&rowVecIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar4,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,
                       (MatrixOp)local_170,true);
            tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&scalarIn);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)__lhs);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(__lhs,&baseName,local_a0);
            std::operator+(&local_190,__lhs,"_fragment");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_190._M_dataplus._M_p,(allocator<char> *)&colVecIn
                      );
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&scalarIn,"Matrix-matrix case",(allocator<char> *)&rowVecIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar4,&vecMatName,(string *)&scalarIn,&matIn,&otherMatIn,
                       (MatrixOp)local_170,false);
            tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&scalarIn);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&local_190);
LAB_00588752:
            std::__cxx11::string::~string((string *)__lhs);
          }
switchD_0058858e_caseD_7:
          if (local_161 != '\0') {
switchD_0058858e_caseD_6:
            scalarIn.inputType = INPUTTYPE_LAST;
            scalarIn.dataType = TYPE_LAST;
            scalarIn.precision = PRECISION_LAST;
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_190,&baseName,"float_vertex");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_190._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,"Matrix case",(allocator<char> *)&colVecIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar4,&vecMatName,&local_c0,&matIn,&scalarIn,(MatrixOp)local_170,true
                      );
            tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&local_190);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_190,&baseName,"float_fragment");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_190._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,"Matrix case",(allocator<char> *)&colVecIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar4,&vecMatName,&local_c0,&matIn,&scalarIn,(MatrixOp)local_170,
                       false);
            tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&local_190);
          }
          if ((((uint)local_170 < 0x13) && ((0x58000U >> ((uint)local_170 & 0x1f) & 1) != 0)) ||
             (bVar15 && vecSize == vecSize_00)) {
            scalarIn.dataType = dataType;
            scalarIn.inputType = IVar13;
            scalarIn.precision = local_19c;
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_190,&baseName,"float_vertex");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_190._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,"Matrix assignment case",(allocator<char> *)&colVecIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar4,&vecMatName,&local_c0,&matIn,&scalarIn,(MatrixOp)local_170,true
                      );
            tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&local_190);
            pSVar7 = (ShaderMatrixCase *)operator_new(0x100);
            pTVar4 = (this->super_TestCaseGroup).super_TestNode.m_testCtx;
            std::operator+(&local_190,&baseName,"float_fragment");
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vecMatName,local_190._M_dataplus._M_p,
                       (allocator<char> *)&otherMatIn);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_c0,"Matrix assignment case",(allocator<char> *)&colVecIn);
            ShaderMatrixCase::ShaderMatrixCase
                      (pSVar7,pTVar4,&vecMatName,&local_c0,&matIn,&scalarIn,(MatrixOp)local_170,
                       false);
            tcu::TestNode::addChild(local_198,(TestNode *)pSVar7);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&vecMatName);
            std::__cxx11::string::~string((string *)&local_190);
          }
          std::__cxx11::string::~string((string *)&baseName);
          lVar10 = lVar10 + 1;
        }
      }
    }
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

void ShaderMatrixTests::init (void)
{
	static const struct
	{
		const char*		name;
		const char*		desc;
		const MatrixOp	op;
		const bool		extendedInputTypeCases; // !< test with const and uniform types too
		const bool		createInputTypeGroup;	// !< create group for input types
	} ops[] =
	{
		{ "add",			"Matrix addition tests",						OP_ADD,				true,	true	},
		{ "sub",			"Matrix subtraction tests",						OP_SUB,				true,	true	},
		{ "mul",			"Matrix multiplication tests",					OP_MUL,				true,	true	},
		{ "div",			"Matrix division tests",						OP_DIV,				true,	true	},
		{ "matrixcompmult",	"Matrix component-wise multiplication tests",	OP_COMP_MUL,		false,	true	},
		{ "outerproduct",	"Matrix outerProduct() tests",					OP_OUTER_PRODUCT,	false,	true	},
		{ "transpose",		"Matrix transpose() tests",						OP_TRANSPOSE,		false,	true	},
		{ "determinant",	"Matrix determinant() tests",					OP_DETERMINANT,		false,	true	},
		{ "inverse",		"Matrix inverse() tests",						OP_INVERSE,			false,	true	},
		{ "unary_addition",	"Matrix unary addition tests",					OP_UNARY_PLUS,		false,	false	},
		{ "negation",		"Matrix negation tests",						OP_NEGATION,		false,	false	},
		{ "pre_increment",	"Matrix prefix increment tests",				OP_PRE_INCREMENT,	false,	false	},
		{ "pre_decrement",	"Matrix prefix decrement tests",				OP_PRE_DECREMENT,	false,	false	},
		{ "post_increment",	"Matrix postfix increment tests",				OP_POST_INCREMENT,	false,	false	},
		{ "post_decrement",	"Matrix postfix decrement tests",				OP_POST_DECREMENT,	false,	false	},
		{ "add_assign",		"Matrix add into tests",						OP_ADD_INTO,		false,	false	},
		{ "sub_assign",		"Matrix subtract from tests",					OP_SUBTRACT_FROM,	false,	false	},
		{ "mul_assign",		"Matrix multiply into tests",					OP_MULTIPLY_INTO,	false,	false	},
		{ "div_assign",		"Matrix divide into tests",						OP_DIVIDE_INTO,		false,	false	},
	};

	struct InputTypeSpec
	{
		const char*		name;
		const char*		desc;
		const InputType	type;
	};
	static const InputTypeSpec extendedInputTypes[] =
	{
		{ "const",		"Constant matrix input",	INPUTTYPE_CONST		},
		{ "uniform",	"Uniform matrix input",		INPUTTYPE_UNIFORM	},
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};
	static const InputTypeSpec reducedInputTypes[] =
	{
		{ "dynamic",	"Dynamic matrix input",		INPUTTYPE_DYNAMIC	}
	};

	static const DataType matrixTypes[] =
	{
		TYPE_FLOAT_MAT2,
		TYPE_FLOAT_MAT2X3,
		TYPE_FLOAT_MAT2X4,
		TYPE_FLOAT_MAT3X2,
		TYPE_FLOAT_MAT3,
		TYPE_FLOAT_MAT3X4,
		TYPE_FLOAT_MAT4X2,
		TYPE_FLOAT_MAT4X3,
		TYPE_FLOAT_MAT4
	};

	static const Precision precisions[] =
	{
		PRECISION_MEDIUMP,
		PRECISION_HIGHP
	};

	for (int opNdx = 0; opNdx < DE_LENGTH_OF_ARRAY(ops); opNdx++)
	{
		const InputTypeSpec*	inTypeList		= (ops[opNdx].extendedInputTypeCases) ? (extendedInputTypes) : (reducedInputTypes);
		const int				inTypeListSize	= (ops[opNdx].extendedInputTypeCases) ? (DE_LENGTH_OF_ARRAY(extendedInputTypes)) : (DE_LENGTH_OF_ARRAY(reducedInputTypes));
		const MatrixOp			op				= ops[opNdx].op;
		tcu::TestCaseGroup*		opGroup			= new tcu::TestCaseGroup(m_testCtx, ops[opNdx].name, ops[opNdx].desc);

		addChild(opGroup);

		for (int inTypeNdx = 0; inTypeNdx < inTypeListSize; inTypeNdx++)
		{
			const InputType		inputType	= inTypeList[inTypeNdx].type;
			tcu::TestCaseGroup* inGroup;

			if (ops[opNdx].createInputTypeGroup)
			{
				inGroup = new tcu::TestCaseGroup(m_testCtx, inTypeList[inTypeNdx].name, inTypeList[inTypeNdx].desc);
				opGroup->addChild(inGroup);
			}
			else
				inGroup = opGroup;

			for (int matTypeNdx = 0; matTypeNdx < DE_LENGTH_OF_ARRAY(matrixTypes); matTypeNdx++)
			{
				DataType	matType		= matrixTypes[matTypeNdx];
				int			numCols		= getDataTypeMatrixNumColumns(matType);
				int			numRows		= getDataTypeMatrixNumRows(matType);
				const char*	matTypeName	= getDataTypeName(matType);

				for (int precNdx = 0; precNdx < DE_LENGTH_OF_ARRAY(precisions); precNdx++)
				{
					Precision	precision	= precisions[precNdx];
					const char*	precName	= getPrecisionName(precision);
					string		baseName	= string(precName) + "_" + matTypeName + "_";
					ShaderInput	matIn		(inputType, matType, precision);

					if (isOperationMatrixScalar(op))
					{
						// Matrix-scalar \note For div cases we use uniform input.
						ShaderInput scalarIn(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, TYPE_FLOAT, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix-scalar case", matIn, scalarIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix-scalar case", matIn, scalarIn, op, false));
					}

					if (isOperationMatrixVector(op))
					{
						// Matrix-vector.
						DataType	colVecType	= getDataTypeFloatVec(numCols);
						ShaderInput colVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, colVecType, precision);

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(colVecType) + "_vertex").c_str(),		"Matrix-vector case", matIn, colVecIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(colVecType) + "_fragment").c_str(),	"Matrix-vector case", matIn, colVecIn, op, false));

						// Vector-matrix.
						DataType	rowVecType	= getDataTypeFloatVec(numRows);
						ShaderInput	rowVecIn	(op == OP_DIV ? INPUTTYPE_UNIFORM : INPUTTYPE_DYNAMIC, rowVecType, precision);
						string		vecMatName	= string(precName) + "_" + getDataTypeName(rowVecType) + "_" + matTypeName;

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (vecMatName + "_vertex").c_str(),		"Vector-matrix case", rowVecIn, matIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (vecMatName + "_fragment").c_str(),	"Vector-matrix case", rowVecIn, matIn, op, false));
					}

					if (isOperationArithmeticMatrixMatrix(op))
					{
						// Arithmetic matrix-matrix multiplication.
						for (int otherCols = 2; otherCols <= 4; otherCols++)
						{
							ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, getDataTypeMatrix(otherCols, numCols /* rows */), precision);
							inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(otherMatIn.dataType) + "_vertex").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, true));
							inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + getDataTypeName(otherMatIn.dataType) + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
						}
					}
					else if (isOperationComponentwiseMatrixMatrix(op))
					{
						// Component-wise.
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + matTypeName + "_vertex").c_str(),		"Matrix-matrix case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + matTypeName + "_fragment").c_str(),	"Matrix-matrix case", matIn, otherMatIn, op, false));
					}

					if (isOperationVectorVector(op))
					{
						ShaderInput vec1In(inputType,																getDataTypeFloatVec(numRows), precision);
						ShaderInput vec2In((inputType == INPUTTYPE_DYNAMIC) ? (INPUTTYPE_UNIFORM) : (inputType),	getDataTypeFloatVec(numCols), precision);

						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Vector-vector case", vec1In, vec2In, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Vector-vector case", vec1In, vec2In, op, false));
					}

					if ((isOperationUnaryAnyMatrix(op)) ||
						(isOperationUnarySymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput voidInput(INPUTTYPE_LAST, TYPE_LAST, PRECISION_LAST);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix case", matIn, voidInput, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix case", matIn, voidInput, op, false));
					}

					if ((isOperationAssignmentAnyMatrix(op)) ||
						(isOperationAssignmentSymmetricMatrix(op) && numCols == numRows))
					{
						ShaderInput otherMatIn(inputType == INPUTTYPE_DYNAMIC ? INPUTTYPE_UNIFORM : inputType, matType, precision);
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_vertex").c_str(),		"Matrix assignment case", matIn, otherMatIn, op, true));
						inGroup->addChild(new ShaderMatrixCase(m_testCtx, (baseName + "float_fragment").c_str(),	"Matrix assignment case", matIn, otherMatIn, op, false));
					}
				}
			}
		}
	}
}